

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O2

TCHAR * __thiscall CASC_CSV::GetString(CASC_CSV *this,size_t Index)

{
  size_t cchLength;
  char *szTarget;
  
  if (Index < this->nColumns) {
    cchLength = this->Columns[Index].nLength;
    szTarget = (char *)malloc(cchLength + 2);
    if (szTarget != (char *)0x0) {
      CopyString(szTarget,this->Columns[Index].szString,cchLength);
      szTarget[cchLength + 1] = '\0';
      return szTarget;
    }
  }
  return (TCHAR *)0x0;
}

Assistant:

TCHAR * CASC_CSV::GetString(size_t Index)
{
    TCHAR * szString;
    size_t nLength;

    // Check for index overflow
    if (Index >= nColumns)
        return NULL;
    nLength = Columns[Index].nLength;

    // Allocate buffer for string. Make it double-zero-terminated
    // in order to be multi-SZ as well
    szString = CASC_ALLOC(TCHAR, nLength + 2);
    if (szString != NULL)
    {
        CopyString(szString, Columns[Index].szString, nLength);
        szString[nLength + 1] = 0;
    }

    return szString;
}